

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O0

void __thiscall
Memory::Recycler::SetObjectBeforeCollectCallback
          (Recycler *this,void *object,ObjectBeforeCollectCallback callback,void *callbackState,
          ObjectBeforeCollectCallbackWrapper callbackWrapper,void *threadContext)

{
  bool bVar1;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *alloc;
  SList<Memory::Recycler::ObjectBeforeCollectCallbackData,_Memory::ArenaAllocator,_RealCount>
  *pSVar2;
  Type *pTVar3;
  ObjectBeforeCollectCallbackData *callbackData;
  EditingIterator iter;
  TrackAllocData local_60;
  void *local_38;
  void *threadContext_local;
  ObjectBeforeCollectCallbackWrapper callbackWrapper_local;
  void *callbackState_local;
  ObjectBeforeCollectCallback callback_local;
  void *object_local;
  Recycler *this_local;
  
  if (this->objectBeforeCollectCallbackState != ObjectBeforeCollectCallback_Shutdown) {
    local_38 = threadContext;
    threadContext_local = callbackWrapper;
    callbackWrapper_local = (ObjectBeforeCollectCallbackWrapper)callbackState;
    callbackState_local = callback;
    callback_local = (ObjectBeforeCollectCallback)object;
    object_local = this;
    if (this->objectBeforeCollectCallbackList == (ObjectBeforeCollectCallbackList *)0x0) {
      if (callback == (ObjectBeforeCollectCallback)0x0) {
        return;
      }
      TrackAllocData::CreateTrackAllocData
                (&local_60,
                 (type_info *)
                 &SList<Memory::Recycler::ObjectBeforeCollectCallbackData,Memory::ArenaAllocator,RealCount>
                  ::typeinfo,0,0xffffffffffffffff,
                 "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                 ,0x2311);
      alloc = ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::TrackAllocInfo
                        (&(this->objectBeforeCollectCallbackArena).
                          super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>,
                         &local_60);
      pSVar2 = (SList<Memory::Recycler::ObjectBeforeCollectCallbackData,_Memory::ArenaAllocator,_RealCount>
                *)new<Memory::ArenaAllocator>(0x18,(ArenaAllocator *)alloc,0x3f67b0);
      SList<Memory::Recycler::ObjectBeforeCollectCallbackData,_Memory::ArenaAllocator,_RealCount>::
      SList(pSVar2,&this->objectBeforeCollectCallbackArena);
      this->objectBeforeCollectCallbackList = pSVar2;
    }
    if (callbackState_local == (void *)0x0) {
      SList<Memory::Recycler::ObjectBeforeCollectCallbackData,_Memory::ArenaAllocator,_RealCount>::
      GetEditingIterator((EditingIterator *)&callbackData,this->objectBeforeCollectCallbackList);
      while (bVar1 = SListBase<Memory::Recycler::ObjectBeforeCollectCallbackData,_Memory::ArenaAllocator,_RealCount>
                     ::EditingIterator::Next((EditingIterator *)&callbackData), bVar1) {
        pTVar3 = SListBase<Memory::Recycler::ObjectBeforeCollectCallbackData,_Memory::ArenaAllocator,_RealCount>
                 ::Iterator::Data((Iterator *)&callbackData);
        if ((ObjectBeforeCollectCallback)pTVar3->object == callback_local) {
          SList<Memory::Recycler::ObjectBeforeCollectCallbackData,_Memory::ArenaAllocator,_RealCount>
          ::EditingIterator::RemoveCurrent((EditingIterator *)&callbackData);
        }
      }
    }
    else {
      pSVar2 = this->objectBeforeCollectCallbackList;
      ObjectBeforeCollectCallbackData::ObjectBeforeCollectCallbackData
                ((ObjectBeforeCollectCallbackData *)&iter.super_EditingIterator.last,callback_local,
                 (ObjectBeforeCollectCallbackWrapper)threadContext_local,
                 (ObjectBeforeCollectCallback)callbackState_local,callbackWrapper_local,local_38);
      SList<Memory::Recycler::ObjectBeforeCollectCallbackData,_Memory::ArenaAllocator,_RealCount>::
      Push(pSVar2,(ObjectBeforeCollectCallbackData *)&iter.super_EditingIterator.last);
      bVar1 = IsInObjectBeforeCollectCallback(this);
      if (bVar1) {
        ScanMemory<false>(this,&callback_local,8);
        ProcessMark(this,false);
      }
    }
  }
  return;
}

Assistant:

void Recycler::SetObjectBeforeCollectCallback(void* object,
    ObjectBeforeCollectCallback callback,
    void* callbackState,
    ObjectBeforeCollectCallbackWrapper callbackWrapper,
    void* threadContext)
{
    if (objectBeforeCollectCallbackState == ObjectBeforeCollectCallback_Shutdown)
    {
        return; // NOP at shutdown
    }

    if (this->objectBeforeCollectCallbackList == nullptr)
    {
        if (callback == nullptr) return;
        this->objectBeforeCollectCallbackList = Anew(&this->objectBeforeCollectCallbackArena, ObjectBeforeCollectCallbackList, &this->objectBeforeCollectCallbackArena);
    }

    if (callback)
    {
        this->objectBeforeCollectCallbackList->Push(ObjectBeforeCollectCallbackData(object, callbackWrapper, callback, callbackState, threadContext));

        if (this->IsInObjectBeforeCollectCallback()) // revive
        {
            this->ScanMemory<false>(&object, sizeof(object));
            this->ProcessMark(/*background*/false);
        }
    }
    else
    {
        // null callback means unregister
        FOREACH_SLIST_ENTRY_EDITING(ObjectBeforeCollectCallbackData, callbackData, this->objectBeforeCollectCallbackList, iter)
        {
            if (callbackData.object == object)
            {
                iter.RemoveCurrent();
            }
        } NEXT_SLIST_ENTRY_EDITING;
    }

}